

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumOptions::SerializeWithCachedSizes(EnumOptions *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  UninterpretedOption *value;
  UnknownFieldSet *pUVar3;
  int local_1c;
  int i;
  CodedOutputStream *output_local;
  EnumOptions *this_local;
  
  bVar1 = has_allow_alias(this);
  if (bVar1) {
    bVar1 = allow_alias(this);
    internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  for (local_1c = 0; iVar2 = uninterpreted_option_size(this), local_1c < iVar2;
      local_1c = local_1c + 1) {
    value = uninterpreted_option(this,local_1c);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar3,output);
  }
  return;
}

Assistant:

void EnumOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional bool allow_alias = 2 [default = true];
  if (has_allow_alias()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->allow_alias(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}